

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superres_scale.c
# Opt level: O0

void av1_superres_post_encode(AV1_COMP *cpi)

{
  int iVar1;
  YV12_BUFFER_CONFIG *pYVar2;
  long in_RDI;
  AV1_COMMON *cm;
  int in_stack_00000030;
  int in_stack_00000034;
  AV1_COMP *in_stack_00000038;
  _Bool in_stack_0000012f;
  BufferPool *in_stack_00000130;
  AV1_COMMON *in_stack_00000138;
  
  av1_superres_upscale(in_stack_00000138,in_stack_00000130,in_stack_0000012f);
  iVar1 = av1_resize_scaled((AV1_COMMON *)(in_RDI + 0x3bf80));
  if (iVar1 == 0) {
    *(undefined8 *)(in_RDI + 0x427a8) = *(undefined8 *)(in_RDI + 0x427b8);
    if (*(long *)(in_RDI + 0x427b0) != 0) {
      *(undefined8 *)(in_RDI + 0x427b0) = *(undefined8 *)(in_RDI + 0x42890);
    }
  }
  else {
    pYVar2 = realloc_and_scale_source(in_stack_00000038,in_stack_00000034,in_stack_00000030);
    *(YV12_BUFFER_CONFIG **)(in_RDI + 0x427a8) = pYVar2;
  }
  return;
}

Assistant:

void av1_superres_post_encode(AV1_COMP *cpi) {
  AV1_COMMON *cm = &cpi->common;

  assert(cpi->oxcf.superres_cfg.enable_superres);
  assert(!is_lossless_requested(&cpi->oxcf.rc_cfg));
  assert(!cm->features.all_lossless);

  av1_superres_upscale(cm, NULL, cpi->alloc_pyramid);

  // If regular resizing is occurring the source will need to be downscaled to
  // match the upscaled superres resolution. Otherwise the original source is
  // used.
  if (!av1_resize_scaled(cm)) {
    cpi->source = cpi->unscaled_source;
    if (cpi->last_source != NULL) cpi->last_source = cpi->unscaled_last_source;
  } else {
    assert(cpi->unscaled_source->y_crop_width != cm->superres_upscaled_width);
    assert(cpi->unscaled_source->y_crop_height != cm->superres_upscaled_height);
    // Do downscale. cm->(width|height) has been updated by
    // av1_superres_upscale
    cpi->source = realloc_and_scale_source(cpi, cm->superres_upscaled_width,
                                           cm->superres_upscaled_height);
  }
}